

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyArchiveInit(SyArchive *pArch,SyMemBackend *pAllocator,ProcHash xHash,ProcRawStrCmp xCmp)

{
  SyArchiveEntry **pSrc;
  ProcRawStrCmp local_48;
  ProcHash local_40;
  SyArchiveEntry **apHash;
  ProcRawStrCmp xCmp_local;
  ProcHash xHash_local;
  SyMemBackend *pAllocator_local;
  SyArchive *pArch_local;
  
  SyZero(pArch,0x58);
  pSrc = (SyArchiveEntry **)SyMemBackendAlloc(pAllocator,0x200);
  if (pSrc == (SyArchiveEntry **)0x0) {
    pArch_local._4_4_ = -1;
  }
  else {
    SyZero(pSrc,0x200);
    pArch->apHash = pSrc;
    local_40 = xHash;
    if (xHash == (ProcHash)0x0) {
      local_40 = SyBinHash;
    }
    pArch->xHash = local_40;
    local_48 = xCmp;
    if (xCmp == (ProcRawStrCmp)0x0) {
      local_48 = ArchiveHashCmp;
    }
    pArch->xCmp = local_48;
    pArch->nSize = 0x40;
    pArch->pAllocator = pAllocator;
    pArch->nMagic = 0xdead635a;
    pArch_local._4_4_ = 0;
  }
  return pArch_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyArchiveInit(SyArchive *pArch, SyMemBackend *pAllocator, ProcHash xHash, ProcRawStrCmp xCmp)
 {
	SyArchiveEntry **apHash;
#if defined(UNTRUST)
 	if( pArch == 0 ){
 		return SXERR_EMPTY;
 	}
#endif
 	SyZero(pArch, sizeof(SyArchive));
 	/* Allocate a new hashtable */ 	
	apHash = (SyArchiveEntry **)SyMemBackendAlloc(&(*pAllocator), SXARCHIVE_HASH_SIZE * sizeof(SyArchiveEntry *));
	if( apHash == 0){
		return SXERR_MEM;
	}
	SyZero(apHash, SXARCHIVE_HASH_SIZE * sizeof(SyArchiveEntry *));
	pArch->apHash = apHash;
	pArch->xHash  = xHash ? xHash : SyBinHash;
	pArch->xCmp   = xCmp ? xCmp : ArchiveHashCmp;
	pArch->nSize  = SXARCHIVE_HASH_SIZE;
 	pArch->pAllocator = &(*pAllocator);
 	pArch->nMagic = SXARCH_MAGIC;
 	return SXRET_OK;
 }